

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O1

void __thiscall
dap::ResponseOrError<dap::VariablesResponse>::~ResponseOrError
          (ResponseOrError<dap::VariablesResponse> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->error).message._M_dataplus._M_p;
  paVar1 = &(this->error).message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::vector<dap::Variable,_std::allocator<dap::Variable>_>::~vector
            ((vector<dap::Variable,_std::allocator<dap::Variable>_> *)this);
  return;
}

Assistant:

inline ResponseOrError() = default;